

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O3

void __thiscall OpenMD::CoordinationNumber::writeOutput(CoordinationNumber *this)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  Revision r;
  ofstream ofs;
  Revision local_251;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,
                        (this->super_StaticAnalyser).analysisType_._M_dataplus._M_p,
                        (this->super_StaticAnalyser).analysisType_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# OpenMD ",9);
    Revision::getFullRevision_abi_cxx11_(&local_250,&local_251);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
    Revision::getBuildDate_abi_cxx11_(&local_250,&local_251);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,local_250._M_dataplus._M_p,local_250._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# selection script1: \"",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,(this->sele1_)._M_dataplus._M_p,(this->sele1_)._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"\"\tselection script2: \"",0x16);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->sele2_)._M_dataplus._M_p,
                        (this->sele2_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"\n",2);
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# parameters: ",0xe)
      ;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,
                          (this->super_StaticAnalyser).paramString_._M_dataplus._M_p,
                          (this->super_StaticAnalyser).paramString_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    if ((this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->histogram_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>((double)uVar3 * this->delta_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->histogram_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar3] / this->delta_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < (ulong)((long)(this->histogram_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->histogram_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CoordinationNumber::writeOutput() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;
      RealType binValue(0.0);

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << sele1_;
      ofs << "\"\tselection script2: \"" << sele2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      for (unsigned int n = 0; n < histogram_.size(); n++) {
        binValue = n * delta_;
        ofs << binValue << "\t" << histogram_[n] / delta_ << "\n";
      }
    }
    ofs.close();
  }